

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O3

void __thiscall
fmt::v9::detail::ansi_color_escape<char>::ansi_color_escape
          (ansi_color_escape<char> *this,emphasis em)

{
  uint8_t uVar1;
  size_t i;
  long lVar2;
  long lVar3;
  bool bVar4;
  uint8_t em_codes [8];
  
  em_codes[0] = '\0';
  em_codes[1] = '\0';
  em_codes[2] = '\0';
  em_codes[3] = '\0';
  em_codes[4] = '\0';
  em_codes[5] = '\0';
  em_codes[6] = '\0';
  em_codes[7] = '\0';
  bVar4 = (em & bold) != ~(strikethrough|conceal|reverse|blink|underline|italic|faint|bold);
  if (bVar4) {
    em_codes[0] = '\x01';
    em_codes[1] = '\0';
    em_codes[2] = '\0';
    em_codes[3] = '\0';
    em_codes[4] = '\0';
    em_codes[5] = '\0';
    em_codes[6] = '\0';
    em_codes[7] = '\0';
  }
  em_codes[1] = '\0';
  em_codes[2] = '\0';
  em_codes[3] = '\0';
  em_codes[4] = '\0';
  em_codes[5] = '\0';
  em_codes[6] = '\0';
  em_codes[7] = '\0';
  em_codes[0] = bVar4;
  if ((em & faint) != ~(strikethrough|conceal|reverse|blink|underline|italic|faint|bold)) {
    em_codes[1] = '\x02';
    em_codes[2] = '\0';
    em_codes[3] = '\0';
    em_codes[4] = '\0';
    em_codes[5] = '\0';
    em_codes[6] = '\0';
    em_codes[7] = '\0';
  }
  if ((em & italic) != ~(strikethrough|conceal|reverse|blink|underline|italic|faint|bold)) {
    em_codes[2] = '\x03';
    em_codes[3] = '\0';
    em_codes[4] = '\0';
    em_codes[5] = '\0';
    em_codes[6] = '\0';
    em_codes[7] = '\0';
  }
  if ((em & underline) != ~(strikethrough|conceal|reverse|blink|underline|italic|faint|bold)) {
    em_codes[3] = '\x04';
    em_codes[4] = '\0';
    em_codes[5] = '\0';
    em_codes[6] = '\0';
    em_codes[7] = '\0';
  }
  if ((em & blink) != ~(strikethrough|conceal|reverse|blink|underline|italic|faint|bold)) {
    em_codes[4] = '\x05';
    em_codes[5] = '\0';
    em_codes[6] = '\0';
    em_codes[7] = '\0';
  }
  if ((em & reverse) != ~(strikethrough|conceal|reverse|blink|underline|italic|faint|bold)) {
    em_codes[5] = '\a';
    em_codes[6] = '\0';
    em_codes[7] = '\0';
  }
  if ((em & conceal) != ~(strikethrough|conceal|reverse|blink|underline|italic|faint|bold)) {
    em_codes[6] = '\b';
    em_codes[7] = '\0';
  }
  if ((char)em < '\0') {
    em_codes[7] = '\t';
  }
  lVar2 = 0;
  lVar3 = 0;
  do {
    uVar1 = em_codes[lVar2];
    if (uVar1 != '\0') {
      (this->buffer + lVar3)[0] = '\x1b';
      (this->buffer + lVar3)[1] = '[';
      this->buffer[lVar3 + 2] = uVar1 + '0';
      this->buffer[lVar3 + 3] = 'm';
      lVar3 = lVar3 + 4;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 8);
  this->buffer[lVar3] = '\0';
  return;
}

Assistant:

FMT_CONSTEXPR ansi_color_escape(emphasis em) noexcept {
    uint8_t em_codes[num_emphases] = {};
    if (has_emphasis(em, emphasis::bold)) em_codes[0] = 1;
    if (has_emphasis(em, emphasis::faint)) em_codes[1] = 2;
    if (has_emphasis(em, emphasis::italic)) em_codes[2] = 3;
    if (has_emphasis(em, emphasis::underline)) em_codes[3] = 4;
    if (has_emphasis(em, emphasis::blink)) em_codes[4] = 5;
    if (has_emphasis(em, emphasis::reverse)) em_codes[5] = 7;
    if (has_emphasis(em, emphasis::conceal)) em_codes[6] = 8;
    if (has_emphasis(em, emphasis::strikethrough)) em_codes[7] = 9;

    size_t index = 0;
    for (size_t i = 0; i < num_emphases; ++i) {
      if (!em_codes[i]) continue;
      buffer[index++] = static_cast<Char>('\x1b');
      buffer[index++] = static_cast<Char>('[');
      buffer[index++] = static_cast<Char>('0' + em_codes[i]);
      buffer[index++] = static_cast<Char>('m');
    }
    buffer[index++] = static_cast<Char>(0);
  }